

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

void __thiscall QPDFObject::move_to(QPDFObject *this,shared_ptr<QPDFObject> *o,bool destroy)

{
  QPDF *pQVar1;
  qpdf_offset_t qVar2;
  element_type *peVar3;
  shared_ptr<QPDFObject> local_40;
  QPDF_Reference local_30;
  byte local_19;
  __shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_18;
  bool destroy_local;
  shared_ptr<QPDFObject> *o_local;
  QPDFObject *this_local;
  
  local_19 = destroy;
  p_Stack_18 = (__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)o;
  o_local = (shared_ptr<QPDFObject> *)this;
  peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)o
                     );
  std::
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  ::operator=(&peVar3->value,&this->value);
  pQVar1 = this->qpdf;
  peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  peVar3->qpdf = pQVar1;
  peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  peVar3->og = this->og;
  peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::operator=(&peVar3->object_description,&this->object_description);
  qVar2 = this->parsed_offset;
  peVar3 = std::__shared_ptr_access<QPDFObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(p_Stack_18);
  peVar3->parsed_offset = qVar2;
  if ((local_19 & 1) == 0) {
    std::shared_ptr<QPDFObject>::shared_ptr(&local_40,(shared_ptr<QPDFObject> *)p_Stack_18);
    QPDF_Reference::QPDF_Reference(&local_30,&local_40);
    std::
    variant<std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
    ::operator=((variant<std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                 *)this,&local_30);
    QPDF_Reference::~QPDF_Reference(&local_30);
    std::shared_ptr<QPDFObject>::~shared_ptr(&local_40);
  }
  return;
}

Assistant:

void
    move_to(std::shared_ptr<QPDFObject>& o, bool destroy)
    {
        o->value = std::move(value);
        o->qpdf = qpdf;
        o->og = og;
        o->object_description = object_description;
        o->parsed_offset = parsed_offset;
        if (!destroy) {
            value = QPDF_Reference(o);
        }
    }